

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  FILE *__s;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *__s1;
  ulong uVar8;
  exr_context_t e;
  undefined8 local_a0;
  undefined8 local_98;
  code *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  code *pcStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong local_38;
  
  iVar7 = 0;
  if (1 < argc) {
    uVar8 = 1;
    bVar3 = false;
    bVar4 = false;
    bVar2 = false;
    iVar7 = 0;
    do {
      __s1 = argv[uVar8];
      cVar1 = *__s1;
      if (((cVar1 == '-') &&
          (((__s1[1] == 'h' && (__s1[2] == '\0')) || ((__s1[1] == '?' && (__s1[2] == '\0')))))) ||
         (iVar5 = strcmp(__s1,"--help"), iVar5 == 0)) {
        __s = _stdout;
        fprintf(_stdout,
                "Usage: %s [-v|--verbose] [-a|--all-metadata] [-s|--strict] <filename> [<filename> ...]\n\n"
                ,"exrinfo");
        fwrite("\nRead exr files and print values of header attributes\n\nOptions:\n  -s, --strict        strict mode\n  -a, --all-metadata  print all metadata\n  -v, --verbose       verbose mode\n  -h, --help          print this message\n      --version       print version information\n\nReport bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
               ,0x172,1,__s);
        return 0;
      }
      iVar5 = strcmp(__s1,"--version");
      if (iVar5 == 0) {
        printf("exrinfo (OpenEXR) %s  https://openexr.com\n","3.2.0");
        puts("Copyright (c) Contributors to the OpenEXR Project");
        puts("License BSD-3-Clause");
        return 0;
      }
      if (cVar1 == '-') {
        if (((__s1[1] == 'v') && (__s1[2] == '\0')) ||
           (iVar5 = strcmp(__s1,"--verbose"), iVar5 == 0)) {
LAB_00101443:
          bVar2 = true;
        }
        else {
          if (__s1[1] == 'a') {
            if (__s1[2] == '\0') goto LAB_00101575;
            iVar5 = strcmp(__s1,"--all-metadata");
          }
          else {
            iVar5 = strcmp(__s1,"--all-metadata");
          }
          if (iVar5 == 0) {
LAB_00101575:
            bVar4 = true;
          }
          else {
            if (((__s1[1] == 's') && (__s1[2] == '\0')) ||
               (iVar5 = strcmp(__s1,"--strict"), iVar5 == 0)) goto LAB_0010157f;
LAB_00101498:
            if (__s1[1] != '\0') {
              main_cold_1();
              return 1;
            }
            local_38 = 0;
            pcStack_70 = stdin_reader;
            if (!bVar2 || bVar3) {
              uVar6 = !bVar2 + 1 + (uint)!bVar2;
              if (!bVar3) {
                uVar6 = 2;
              }
              local_38 = (ulong)uVar6;
            }
            __s1 = "<stdin>";
LAB_0010153a:
            uStack_40 = 0xbf800000fffffffe;
            local_48 = 0;
            uStack_50 = 0;
            local_58 = 0;
            uStack_60 = 0;
            local_68 = 0;
            local_78 = 0;
            uStack_80 = 0;
            local_88 = 0;
            local_90 = error_handler_cb;
            local_98 = 0x68;
            local_a0 = 0;
            iVar5 = exr_start_read(&local_a0,__s1,&local_98);
            if (iVar5 == 0) {
              exr_print_context_info(local_a0,bVar4 || bVar2);
              exr_finish(&local_a0);
            }
            iVar7 = iVar7 + (uint)(iVar5 != 0);
          }
        }
      }
      else {
        iVar5 = strcmp(__s1,"--verbose");
        if (iVar5 == 0) goto LAB_00101443;
        iVar5 = strcmp(__s1,"--all-metadata");
        if (iVar5 == 0) goto LAB_00101575;
        iVar5 = strcmp(__s1,"--strict");
        if (iVar5 != 0) {
          if (cVar1 == '-') goto LAB_00101498;
          local_38 = 0;
          pcStack_70 = (code *)0x0;
          if (!bVar2 || bVar3) {
            uVar6 = !bVar2 + 1 + (uint)!bVar2;
            if (!bVar3) {
              uVar6 = 2;
            }
            local_38 = (ulong)uVar6;
          }
          goto LAB_0010153a;
        }
LAB_0010157f:
        bVar3 = true;
      }
      uVar8 = uVar8 + 1;
    } while ((uint)argc != uVar8);
  }
  return iVar7;
}

Assistant:

int
main (int argc, const char* argv[])
{
    int rv = 0, nfiles = 0, verbose = 0, allmeta = 0, strict = 0;

    for (int a = 1; a < argc; ++a)
    {
        if (!strcmp (argv[a], "-h") || !strcmp (argv[a], "-?") ||
            !strcmp (argv[a], "--help"))
        {
            usage (stdout, "exrinfo", 1);
            return 0;
        }
        else if (!strcmp (argv[a], "--version"))
        {
            printf("exrinfo (OpenEXR) %s  https://openexr.com\n", OPENEXR_VERSION_STRING);
            printf("Copyright (c) Contributors to the OpenEXR Project\n");
            printf("License BSD-3-Clause\n");
            return 0;
        }
        else if (!strcmp (argv[a], "-v") || !strcmp (argv[a], "--verbose"))
        {
            verbose = 1;
        }
        else if (!strcmp (argv[a], "-a") || !strcmp (argv[a], "--all-metadata"))
        {
            allmeta = 1;
        }
        else if (!strcmp (argv[a], "-s") || !strcmp (argv[a], "--strict"))
        {
            strict = 1;
        }
        else if (!strcmp (argv[a], "-"))
        {
            ++nfiles;
            rv += process_stdin (verbose, allmeta, strict);
        }
        else if (argv[a][0] == '-')
        {
            usage (stderr, argv[0], 0);
            return 1;
        }
        else
        {
            ++nfiles;
            rv += process_file (argv[a], verbose, allmeta, strict);
        }
    }

    return rv;
}